

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::mergeGlobalUniformBlocks
          (TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit,bool mergeExistingOnly)

{
  undefined8 uVar1;
  anon_class_16_2_ca345a4c __f;
  anon_class_16_2_394fd328 __f_00;
  bool bVar2;
  int iVar3;
  TIntermAggregate *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar5;
  iterator iVar6;
  TIntermSymbol *block_00;
  TIntermSymbol *unitBlock_00;
  undefined4 extraout_var_03;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__lhs;
  undefined4 extraout_var_04;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__rhs;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  reference ppTVar7;
  TIntermSymbol *unitBlock;
  TIntermSymbol *block;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_100;
  iterator itBlock;
  iterator iStack_f0;
  bool add;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_e8;
  iterator itUnitBlock;
  anon_class_1_0_00000001 local_79;
  undefined1 local_78 [7];
  anon_class_1_0_00000001 filter;
  TIntermSequence unitDefaultBlocks;
  TIntermSequence defaultBlocks;
  TIntermSequence *unitLinkerObjects;
  TIntermSequence *linkerObjects;
  bool mergeExistingOnly_local;
  TIntermediate *unit_local;
  TInfoSink *infoSink_local;
  TIntermediate *this_local;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pTVar4 = findLinkerObjects(this);
  iVar3 = (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])();
  this_00 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
            CONCAT44(extraout_var,iVar3);
  pTVar4 = findLinkerObjects(unit);
  iVar3 = (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])();
  TVector<TIntermNode_*>::TVector
            ((TVector<TIntermNode_*> *)
             &unitDefaultBlocks.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
              .super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  TVector<TIntermNode_*>::TVector((TVector<TIntermNode_*> *)local_78);
  iVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin(this_00);
  iVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end(this_00);
  __f_00.filter = &local_79;
  __f_00.defaultBlocks =
       (TIntermSequence *)
       &unitDefaultBlocks.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::
  for_each<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,glslang::TIntermediate::mergeGlobalUniformBlocks(TInfoSink&,glslang::TIntermediate&,bool)::__0>
            ((__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
              )iVar5._M_current,
             (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
              )iVar6._M_current,__f_00);
  iVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                    ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                     CONCAT44(extraout_var_00,iVar3));
  iVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                    ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                     CONCAT44(extraout_var_00,iVar3));
  __f.filter = &local_79;
  __f.unitDefaultBlocks = (TIntermSequence *)local_78;
  _itUnitBlock = std::
                 for_each<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,glslang::TIntermediate::mergeGlobalUniformBlocks(TInfoSink&,glslang::TIntermediate&,bool)::__1>
                           ((__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                             )iVar5._M_current,
                            (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                             )iVar6._M_current,__f);
  local_e8._M_current =
       (TIntermNode **)
       std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                 ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)local_78);
  do {
    iStack_f0 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                          ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                           local_78);
    bVar2 = __gnu_cxx::operator!=(&local_e8,&stack0xffffffffffffff10);
    if (!bVar2) {
      TVector<TIntermNode_*>::~TVector((TVector<TIntermNode_*> *)local_78);
      TVector<TIntermNode_*>::~TVector
                ((TVector<TIntermNode_*> *)
                 &unitDefaultBlocks.
                  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      return;
    }
    itBlock._M_current._7_1_ = (mergeExistingOnly ^ 0xffU) & 1;
    local_100._M_current =
         (TIntermNode **)
         std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                   ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    &unitDefaultBlocks.
                     super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                     super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      block = (TIntermSymbol *)
              std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                        ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                         &unitDefaultBlocks.
                          super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                          super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = __gnu_cxx::operator!=
                        (&local_100,
                         (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                          *)&block);
      if (!bVar2) break;
      ppTVar7 = __gnu_cxx::
                __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                ::operator*(&local_100);
      iVar3 = (*(*ppTVar7)->_vptr_TIntermNode[0xc])();
      block_00 = (TIntermSymbol *)CONCAT44(extraout_var_01,iVar3);
      ppTVar7 = __gnu_cxx::
                __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                ::operator*(&local_e8);
      iVar3 = (*(*ppTVar7)->_vptr_TIntermNode[0xc])();
      unitBlock_00 = (TIntermSymbol *)CONCAT44(extraout_var_02,iVar3);
      if (block_00 == (TIntermSymbol *)0x0 || unitBlock_00 == (TIntermSymbol *)0x0) {
        __assert_fail("block && unitBlock",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                      ,0x2ae,
                      "void glslang::TIntermediate::mergeGlobalUniformBlocks(TInfoSink &, TIntermediate &, bool)"
                     );
      }
      iVar3 = (*(block_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      __lhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x28))();
      iVar3 = (*(unitBlock_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      __rhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x28))();
      bVar2 = std::operator==(__lhs,__rhs);
      if (bVar2) {
        iVar3 = (*(block_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
        uVar1 = *(undefined8 *)(CONCAT44(extraout_var_05,iVar3) + 8);
        iVar3 = (*(unitBlock_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
        if (((uint)uVar1 & 0x7f) ==
            ((uint)*(undefined8 *)(CONCAT44(extraout_var_06,iVar3) + 8) & 0x7f)) {
          itBlock._M_current._7_1_ = 0;
          mergeBlockDefinitions(this,infoSink,block_00,unitBlock_00,unit);
        }
      }
      __gnu_cxx::
      __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
      ::operator++(&local_100,0);
    }
    if ((itBlock._M_current._7_1_ & 1) != 0) {
      ppTVar7 = __gnu_cxx::
                __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                ::operator*(&local_e8);
      std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                (this_00,ppTVar7);
    }
    __gnu_cxx::
    __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
    ::operator++(&local_e8,0);
  } while( true );
}

Assistant:

void TIntermediate::mergeGlobalUniformBlocks(TInfoSink& infoSink, TIntermediate& unit, bool mergeExistingOnly)
{
    TIntermSequence& linkerObjects = findLinkerObjects()->getSequence();
    TIntermSequence& unitLinkerObjects = unit.findLinkerObjects()->getSequence();

    // build lists of default blocks from the intermediates
    TIntermSequence defaultBlocks;
    TIntermSequence unitDefaultBlocks;

    auto filter = [](TIntermSequence& list, TIntermNode* node) {
        if (node->getAsSymbolNode()->getQualifier().defaultBlock) {
            list.push_back(node);
        }
    };

    std::for_each(linkerObjects.begin(), linkerObjects.end(),
        [&defaultBlocks, &filter](TIntermNode* node) {
            filter(defaultBlocks, node);
        });
    std::for_each(unitLinkerObjects.begin(), unitLinkerObjects.end(),
        [&unitDefaultBlocks, &filter](TIntermNode* node) {
            filter(unitDefaultBlocks, node);
    });

    auto itUnitBlock = unitDefaultBlocks.begin();
    for (; itUnitBlock != unitDefaultBlocks.end(); itUnitBlock++) {

        bool add = !mergeExistingOnly;
        auto itBlock = defaultBlocks.begin();

        for (; itBlock != defaultBlocks.end(); itBlock++) {
            TIntermSymbol* block = (*itBlock)->getAsSymbolNode();
            TIntermSymbol* unitBlock = (*itUnitBlock)->getAsSymbolNode();

            assert(block && unitBlock);

            // if the two default blocks match, then merge their definitions
            if (block->getType().getTypeName() == unitBlock->getType().getTypeName() &&
                block->getQualifier().storage == unitBlock->getQualifier().storage) {
                add = false;
                mergeBlockDefinitions(infoSink, block, unitBlock, &unit);
            }
        }
        if (add) {
            // push back on original list; won't change the size of the list we're iterating over
            linkerObjects.push_back(*itUnitBlock);
        }
    }
}